

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplaceRealloc<slang::ast::LValue::ArrayLookup>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,pointer pos,ArrayLookup *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pvVar4;
  long lVar5;
  pointer pvVar6;
  EVP_PKEY_CTX *ctx;
  iterator in_RSI;
  SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
  *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ArrayLookup *in_stack_ffffffffffffff98;
  variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
                    *)0x6670cb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pvVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pvVar4;
  pvVar6 = (pointer)operator_new(0x66712d);
  std::
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  ::variant<slang::ast::LValue::ArrayLookup,void,void,slang::ast::LValue::ArrayLookup,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pvVar4 = end(in_RDI);
  if (in_RSI == pvVar4) {
    pvVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
              (in_RSI,__last,pvVar4);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::
    uninitialized_move<std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*,std::variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pvVar6;
  return pvVar6 + lVar5 / 0x58;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}